

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

LY_ERR ly_vprint_(ly_out *out,char *format,__va_list_tag *ap)

{
  void *pvVar1;
  int *piVar2;
  char *pcVar3;
  char *local_38;
  char *msg;
  int written;
  LY_ERR ret;
  __va_list_tag *ap_local;
  char *format_local;
  ly_out *out_local;
  
  msg._0_4_ = 0;
  local_38 = (char *)0x0;
  _written = ap;
  ap_local = (__va_list_tag *)format;
  format_local = (char *)out;
  switch(out->type) {
  case LY_OUT_FD:
    msg._0_4_ = vdprintf((out->method).fd,format,ap);
    break;
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
    msg._0_4_ = vfprintf((FILE *)(out->method).f,format,ap);
    break;
  case LY_OUT_MEMORY:
    msg._0_4_ = vasprintf(&local_38,format,ap);
    if (-1 < (int)msg) {
      if (*(ulong *)(format_local + 0x18) < *(long *)(format_local + 0x10) + (long)(int)msg + 1U) {
        pvVar1 = ly_realloc((void *)**(undefined8 **)(format_local + 8),
                            *(long *)(format_local + 0x10) + (long)(int)msg + 1);
        **(undefined8 **)(format_local + 8) = pvVar1;
        if (**(long **)(format_local + 8) == 0) {
          format_local[0x10] = '\0';
          format_local[0x11] = '\0';
          format_local[0x12] = '\0';
          format_local[0x13] = '\0';
          format_local[0x14] = '\0';
          format_local[0x15] = '\0';
          format_local[0x16] = '\0';
          format_local[0x17] = '\0';
          format_local[0x18] = '\0';
          format_local[0x19] = '\0';
          format_local[0x1a] = '\0';
          format_local[0x1b] = '\0';
          format_local[0x1c] = '\0';
          format_local[0x1d] = '\0';
          format_local[0x1e] = '\0';
          format_local[0x1f] = '\0';
          free(local_38);
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vprint_");
          return LY_EMEM;
        }
        *(long *)(format_local + 0x18) = *(long *)(format_local + 0x10) + (long)(int)msg + 1;
      }
      if ((int)msg != 0) {
        memcpy((void *)(**(long **)(format_local + 8) + *(long *)(format_local + 0x10)),local_38,
               (long)(int)msg);
      }
      *(long *)(format_local + 0x10) = (long)(int)msg + *(long *)(format_local + 0x10);
      *(undefined1 *)(**(long **)(format_local + 8) + *(long *)(format_local + 0x10)) = 0;
      free(local_38);
    }
    break;
  case LY_OUT_CALLBACK:
    msg._0_4_ = vasprintf(&local_38,format,ap);
    if (-1 < (int)msg) {
      msg._0_4_ = (**(code **)(format_local + 8))
                            (*(undefined8 *)(format_local + 0x10),local_38,(long)(int)msg);
      free(local_38);
    }
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x1e2);
    return LY_EINT;
  }
  if ((int)msg < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"%s: writing data failed (%s).","ly_vprint_",pcVar3);
    msg._0_4_ = 0;
    msg._4_4_ = LY_ESYS;
  }
  else {
    if (*(int *)format_local == 1) {
      lseek(*(int *)(format_local + 0x10),0,2);
    }
    msg._4_4_ = LY_SUCCESS;
  }
  *(long *)(format_local + 0x40) = (long)(int)msg + *(long *)(format_local + 0x40);
  *(long *)(format_local + 0x48) = (long)(int)msg + *(long *)(format_local + 0x48);
  return msg._4_4_;
}

Assistant:

static LY_ERR
ly_vprint_(struct ly_out *out, const char *format, va_list ap)
{
    LY_ERR ret;
    int written = 0;
    char *msg = NULL;

    switch (out->type) {
    case LY_OUT_FD:
        written = vdprintf(out->method.fd, format, ap);
        break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        written = vfprintf(out->method.f, format, ap);
        break;
    case LY_OUT_MEMORY:
        if ((written = vasprintf(&msg, format, ap)) < 0) {
            break;
        }
        if (out->method.mem.len + written + 1 > out->method.mem.size) {
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, out->method.mem.len + written + 1);
            if (!*out->method.mem.buf) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                free(msg);
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = out->method.mem.len + written + 1;
        }
        if (written) {
            memcpy(&(*out->method.mem.buf)[out->method.mem.len], msg, written);
        }
        out->method.mem.len += written;
        (*out->method.mem.buf)[out->method.mem.len] = '\0';
        free(msg);
        break;
    case LY_OUT_CALLBACK:
        if ((written = vasprintf(&msg, format, ap)) < 0) {
            break;
        }
        written = out->method.clb.func(out->method.clb.arg, msg, written);
        free(msg);
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    if (written < 0) {
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (%s).", __func__, strerror(errno));
        written = 0;
        ret = LY_ESYS;
    } else {
        if (out->type == LY_OUT_FDSTREAM) {
            /* move the original file descriptor to the end of the output file */
            lseek(out->method.fdstream.fd, 0, SEEK_END);
        }
        ret = LY_SUCCESS;
    }

    out->printed += written;
    out->func_printed += written;
    return ret;
}